

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

bool_t NodeContext_Cleanup(nodecontext *p,bool_t Force)

{
  nodemodule *local_28;
  nodemodule *i;
  bool_t Found;
  bool_t Force_local;
  nodecontext *p_local;
  
  i = (nodemodule *)0x0;
  if (p->FreeModule != (_func_void_nodecontext_ptr_nodemodule_ptr *)0x0) {
    for (local_28 = (p->Base).Next; local_28 != (nodemodule *)0x0; local_28 = local_28->Next) {
      if ((local_28->Module != (void *)0x0) &&
         ((Force != 0 || ((local_28->Config == '\0' && ((local_28->Base).RefCount == 1)))))) {
        if (Force == 0) {
          NodeSingletonEvent(p,10,local_28);
        }
        UnRegisterModule(p,local_28,0);
        (*p->FreeModule)(p,local_28);
        i = (nodemodule *)0x1;
      }
    }
  }
  return (bool_t)i;
}

Assistant:

NOINLINE bool_t NodeContext_Cleanup(nodecontext* p,bool_t Force)
{
    // at the moment we only release modules without any object (not even singleton objects)
    // because cleanup and singleton object releasing could have multithreading issues...

    bool_t Found=0;
    if (p->FreeModule)
    {
        nodemodule* i;
        for (i=p->Base.Next;i;i=i->Next)
            if (i->Module && (Force || (!i->Config && i->Base.RefCount==1)))
            {
                if (!Force)
                    NodeSingletonEvent(p,NODE_SINGLETON_SHUTDOWN,i);
                UnRegisterModule(p,i,0);
                p->FreeModule(p,i);
                Found = 1;
            }
    }
    return Found;
}